

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamToolsIndex::RaiiWrapper::~RaiiWrapper(RaiiWrapper *this)

{
  if (this->Device != (IBamIODevice *)0x0) {
    (*this->Device->_vptr_IBamIODevice[2])();
    if (this->Device != (IBamIODevice *)0x0) {
      (*this->Device->_vptr_IBamIODevice[1])();
    }
    this->Device = (IBamIODevice *)0x0;
  }
  return;
}

Assistant:

BamToolsIndex::RaiiWrapper::~RaiiWrapper()
{
    if (Device) {
        Device->Close();
        delete Device;
        Device = 0;
    }
}